

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

deUint32 __thiscall
sglr::ReferenceContext::blitResolveMultisampleFramebuffer
          (ReferenceContext *this,deUint32 mask,IVec4 *srcRect,IVec4 *dstRect,bool flipX,bool flipY)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TextureChannelClass TVar7;
  ContextType type;
  int iVar8;
  TextureFormat *pTVar9;
  ConstPixelBufferAccess *pCVar10;
  void *pvVar11;
  float *pfVar12;
  uint *puVar13;
  bool bVar14;
  int local_534;
  deUint32 local_530;
  int local_500;
  float local_4dc;
  float local_4d8;
  bool local_4a1;
  undefined1 local_45c [24];
  deUint32 srcStencil;
  int srcY_2;
  int srcX_2;
  int y_2;
  int x_2;
  MultisamplePixelBufferAccess local_410;
  undefined1 local_3e8 [8];
  MultisamplePixelBufferAccess dst_2;
  MultisamplePixelBufferAccess local_398;
  MultisamplePixelBufferAccess local_370;
  undefined1 local_348 [8];
  MultisampleConstPixelBufferAccess src_2;
  int srcY_1;
  int srcX_1;
  int y_1;
  int x_1;
  undefined1 local_2d8 [8];
  MultisamplePixelBufferAccess dst_1;
  MultisamplePixelBufferAccess local_288;
  undefined1 local_260 [8];
  MultisampleConstPixelBufferAccess src_1;
  Vector<float,_4> local_228;
  undefined1 local_218 [8];
  Vec4 p;
  int srcY;
  int srcX;
  int y;
  int x;
  PixelBufferAccess local_1f0;
  MultisampleConstPixelBufferAccess local_1c8;
  ConstPixelBufferAccess local_1a0;
  TextureFormat local_178;
  TextureFormat srcFmt;
  ConstPixelBufferAccess srcRaw;
  bool convertSRGB;
  bool dstIsSRGB;
  undefined1 local_120 [2];
  bool srcIsSRGB;
  bool dstIsFloat;
  TextureChannelClass dstClass;
  PixelBufferAccess local_f8;
  undefined1 local_d0 [8];
  PixelBufferAccess dst;
  MultisamplePixelBufferAccess local_80;
  undefined1 local_58 [8];
  MultisampleConstPixelBufferAccess src;
  bool flipY_local;
  bool flipX_local;
  IVec4 *dstRect_local;
  IVec4 *srcRect_local;
  deUint32 mask_local;
  ReferenceContext *this_local;
  
  src.m_access.m_data._6_1_ = flipY;
  src.m_access.m_data._7_1_ = flipX;
  if ((mask & 0x4000) != 0) {
    getReadColorbuffer((MultisamplePixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data,this
                      );
    iVar3 = tcu::Vector<int,_4>::x(srcRect);
    iVar4 = tcu::Vector<int,_4>::y(srcRect);
    iVar5 = tcu::Vector<int,_4>::z(srcRect);
    iVar6 = tcu::Vector<int,_4>::w(srcRect);
    rr::getSubregion(&local_80,
                     (MultisamplePixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data,iVar3,
                     iVar4,iVar5,iVar6);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)local_58,&local_80);
    getDrawColorbuffer((MultisamplePixelBufferAccess *)local_120,this);
    rr::MultisamplePixelBufferAccess::toSinglesampleAccess
              (&local_f8,(MultisamplePixelBufferAccess *)local_120);
    iVar3 = tcu::Vector<int,_4>::x(dstRect);
    iVar4 = tcu::Vector<int,_4>::y(dstRect);
    iVar5 = tcu::Vector<int,_4>::z(dstRect);
    iVar6 = tcu::Vector<int,_4>::w(dstRect);
    tcu::getSubregion((PixelBufferAccess *)local_d0,&local_f8,iVar3,iVar4,iVar5,iVar6);
    pTVar9 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_d0);
    TVar7 = tcu::getTextureChannelClass(pTVar9->type);
    bVar14 = true;
    if ((TVar7 != TEXTURECHANNELCLASS_FLOATING_POINT) &&
       (bVar14 = true, TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      bVar14 = TVar7 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
    }
    pCVar10 = rr::MultisampleConstPixelBufferAccess::raw
                        ((MultisampleConstPixelBufferAccess *)local_58);
    pTVar9 = tcu::ConstPixelBufferAccess::getFormat(pCVar10);
    bVar1 = tcu::isSRGB(*pTVar9);
    pTVar9 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_d0);
    bVar2 = tcu::isSRGB(*pTVar9);
    local_4a1 = false;
    if ((this->m_sRGBUpdateEnabled & 1U) != 0) {
      type = Context::getType(&this->super_Context);
      local_4a1 = glu::isContextTypeES(type);
    }
    if (local_4a1 == false) {
      pCVar10 = rr::MultisampleConstPixelBufferAccess::raw
                          ((MultisampleConstPixelBufferAccess *)local_58);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&srcFmt,pCVar10)
      ;
      pTVar9 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&srcFmt);
      local_178 = toNonSRGBFormat(pTVar9);
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&srcFmt);
      iVar4 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&srcFmt);
      iVar5 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&srcFmt);
      iVar6 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)&srcFmt);
      iVar8 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)&srcFmt);
      pvVar11 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)&srcFmt);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_1a0,&local_178,iVar3,iVar4,iVar5,iVar6,iVar8,pvVar11);
      memcpy(&srcFmt,&local_1a0,0x28);
      rr::MultisampleConstPixelBufferAccess::fromMultisampleAccess
                (&local_1c8,(ConstPixelBufferAccess *)&srcFmt);
      memcpy(local_58,&local_1c8,0x28);
      pTVar9 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_d0);
      _y = toNonSRGBFormat(pTVar9);
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_d0);
      iVar4 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_d0);
      iVar5 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_d0);
      iVar6 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)local_d0);
      iVar8 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)local_d0);
      pvVar11 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_d0);
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_1f0,(TextureFormat *)&y,iVar3,iVar4,iVar5,iVar6,iVar8,pvVar11);
      memcpy(local_d0,&local_1f0,0x28);
    }
    for (srcX = 0; iVar3 = tcu::Vector<int,_4>::z(dstRect), srcX < iVar3; srcX = srcX + 1) {
      for (srcY = 0; iVar3 = tcu::Vector<int,_4>::w(dstRect), srcY < iVar3; srcY = srcY + 1) {
        if ((src.m_access.m_data._7_1_ & 1) == 0) {
          local_4d8 = (float)srcX;
        }
        else {
          iVar3 = tcu::Vector<int,_4>::z(srcRect);
          local_4d8 = (float)((iVar3 - srcX) + -1);
        }
        p.m_data[3] = local_4d8;
        if ((src.m_access.m_data._6_1_ & 1) == 0) {
          local_4dc = (float)srcY;
        }
        else {
          iVar3 = tcu::Vector<int,_4>::z(srcRect);
          local_4dc = (float)((iVar3 - srcY) + -1);
        }
        p.m_data[2] = local_4dc;
        if ((bVar14) || (bVar1)) {
          pCVar10 = rr::MultisampleConstPixelBufferAccess::raw
                              ((MultisampleConstPixelBufferAccess *)local_58);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_218,(int)pCVar10,0,(int)p.m_data[3]);
          if ((bVar2) && (local_4a1 != false)) {
            tcu::linearToSRGB((tcu *)&local_228,(Vec4 *)local_218);
          }
          else {
            tcu::Vector<float,_4>::Vector(&local_228,(Vector<float,_4> *)local_218);
          }
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_d0,&local_228,srcX,srcY,0);
        }
        else {
          pCVar10 = rr::MultisampleConstPixelBufferAccess::raw
                              ((MultisampleConstPixelBufferAccess *)local_58);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&src_1.m_access.m_data,(int)pCVar10,0,
                     (int)p.m_data[3]);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_d0,(IVec4 *)&src_1.m_access.m_data,srcX,srcY,0);
        }
      }
    }
  }
  if ((mask & 0x100) != 0) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)
                       &dst_1.m_access.super_ConstPixelBufferAccess.m_data,this);
    iVar3 = tcu::Vector<int,_4>::x(srcRect);
    iVar4 = tcu::Vector<int,_4>::y(srcRect);
    iVar5 = tcu::Vector<int,_4>::z(srcRect);
    iVar6 = tcu::Vector<int,_4>::w(srcRect);
    rr::getSubregion(&local_288,
                     (MultisamplePixelBufferAccess *)
                     &dst_1.m_access.super_ConstPixelBufferAccess.m_data,iVar3,iVar4,iVar5,iVar6);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)local_260,&local_288);
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&y_1,this);
    iVar3 = tcu::Vector<int,_4>::x(dstRect);
    iVar4 = tcu::Vector<int,_4>::y(dstRect);
    iVar5 = tcu::Vector<int,_4>::z(dstRect);
    iVar6 = tcu::Vector<int,_4>::w(dstRect);
    rr::getSubregion((MultisamplePixelBufferAccess *)local_2d8,(MultisamplePixelBufferAccess *)&y_1,
                     iVar3,iVar4,iVar5,iVar6);
    for (srcX_1 = 0; iVar3 = tcu::Vector<int,_4>::z(dstRect), srcX_1 < iVar3; srcX_1 = srcX_1 + 1) {
      for (srcY_1 = 0; iVar3 = tcu::Vector<int,_4>::w(dstRect), srcY_1 < iVar3; srcY_1 = srcY_1 + 1)
      {
        if ((src.m_access.m_data._7_1_ & 1) == 0) {
          local_500 = srcX_1;
        }
        else {
          iVar3 = tcu::Vector<int,_4>::z(srcRect);
          local_500 = (iVar3 - srcX_1) + -1;
        }
        if ((src.m_access.m_data._6_1_ & 1) != 0) {
          tcu::Vector<int,_4>::z(srcRect);
        }
        pCVar10 = rr::MultisampleConstPixelBufferAccess::raw
                            ((MultisampleConstPixelBufferAccess *)local_260);
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&src_2.m_access.m_data,(int)pCVar10,0,local_500);
        pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&src_2.m_access.m_data);
        writeDepthOnly((MultisamplePixelBufferAccess *)local_2d8,0,srcX_1,srcY_1,*pfVar12);
      }
    }
  }
  if ((mask & 0x400) != 0) {
    getReadStencilbuffer
              ((MultisamplePixelBufferAccess *)&dst_2.m_access.super_ConstPixelBufferAccess.m_data,
               this);
    iVar3 = tcu::Vector<int,_4>::x(srcRect);
    iVar4 = tcu::Vector<int,_4>::y(srcRect);
    iVar5 = tcu::Vector<int,_4>::z(srcRect);
    iVar6 = tcu::Vector<int,_4>::w(srcRect);
    rr::getSubregion(&local_398,
                     (MultisamplePixelBufferAccess *)
                     &dst_2.m_access.super_ConstPixelBufferAccess.m_data,iVar3,iVar4,iVar5,iVar6);
    getStencilMultisampleAccess(&local_370,&local_398);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)local_348,&local_370);
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&y_2,this);
    iVar3 = tcu::Vector<int,_4>::x(dstRect);
    iVar4 = tcu::Vector<int,_4>::y(dstRect);
    iVar5 = tcu::Vector<int,_4>::z(dstRect);
    iVar6 = tcu::Vector<int,_4>::w(dstRect);
    rr::getSubregion(&local_410,(MultisamplePixelBufferAccess *)&y_2,iVar3,iVar4,iVar5,iVar6);
    getStencilMultisampleAccess((MultisamplePixelBufferAccess *)local_3e8,&local_410);
    for (srcX_2 = 0; iVar3 = srcX_2, iVar4 = tcu::Vector<int,_4>::z(dstRect), iVar3 < iVar4;
        srcX_2 = srcX_2 + 1) {
      for (srcY_2 = 0; iVar3 = srcY_2, iVar4 = tcu::Vector<int,_4>::w(dstRect), iVar3 < iVar4;
          srcY_2 = srcY_2 + 1) {
        if ((src.m_access.m_data._7_1_ & 1) == 0) {
          local_530 = srcX_2;
        }
        else {
          iVar3 = tcu::Vector<int,_4>::z(srcRect);
          local_530 = (iVar3 - srcX_2) - 1;
        }
        srcStencil = local_530;
        if ((src.m_access.m_data._6_1_ & 1) == 0) {
          local_534 = srcY_2;
        }
        else {
          iVar3 = tcu::Vector<int,_4>::z(srcRect);
          local_534 = (iVar3 - srcY_2) + -1;
        }
        local_45c._20_4_ = local_534;
        pCVar10 = rr::MultisampleConstPixelBufferAccess::raw
                            ((MultisampleConstPixelBufferAccess *)local_348);
        tcu::ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)local_45c,(int)pCVar10,0,srcStencil);
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_45c);
        local_45c._16_4_ = *puVar13;
        writeMaskedStencil((MultisamplePixelBufferAccess *)local_3e8,0,srcX_2,srcY_2,
                           local_45c._16_4_,this->m_stencil[0].writeMask);
      }
    }
  }
  return 0;
}

Assistant:

deUint32 ReferenceContext::blitResolveMultisampleFramebuffer (deUint32 mask, const IVec4& srcRect, const IVec4& dstRect, bool flipX, bool flipY)
{
	if (mask & GL_COLOR_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src			= rr::getSubregion(getReadColorbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess					dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass				dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool									dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
															  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
															  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		bool									srcIsSRGB	= tcu::isSRGB(src.raw().getFormat());
		bool									dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool								convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			tcu::ConstPixelBufferAccess	srcRaw	= src.raw();
			tcu::TextureFormat			srcFmt	= toNonSRGBFormat(srcRaw.getFormat());

			srcRaw	= tcu::ConstPixelBufferAccess(srcFmt, srcRaw.getWidth(), srcRaw.getHeight(), srcRaw.getDepth(), srcRaw.getRowPitch(), srcRaw.getSlicePitch(), srcRaw.getDataPtr());
			src		= rr::MultisampleConstPixelBufferAccess::fromMultisampleAccess(srcRaw);

			dst		= tcu::PixelBufferAccess(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int srcX = (flipX) ? (srcRect.z() - x - 1) : (x);
			int srcY = (flipY) ? (srcRect.z() - y - 1) : (y);

			if (dstIsFloat || srcIsSRGB)
			{
				Vec4 p = src.raw().getPixel(0, srcX,srcY);
				dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, x, y);
			}
			else
				dst.setPixel(src.raw().getPixelInt(0, srcX, srcY), x, y);
		}
	}

	if (mask & GL_DEPTH_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		rr::MultisamplePixelBufferAccess		dst	= rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int srcX = (flipX) ? (srcRect.z() - x - 1) : (x);
			int srcY = (flipY) ? (srcRect.z() - y - 1) : (y);

			writeDepthOnly(dst, 0, x, y, src.raw().getPixel(0, srcX, srcY).x());
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int			srcX		= (flipX) ? (srcRect.z() - x - 1) : (x);
			int			srcY		= (flipY) ? (srcRect.z() - y - 1) : (y);
			deUint32	srcStencil	= src.raw().getPixelUint(0, srcX, srcY).x();

			writeMaskedStencil(dst, 0, x, y, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}

	return GL_NO_ERROR;
}